

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffc2uj(char *cval,ULONGLONG *ival,int *status)

{
  int iVar1;
  ulong uVar2;
  char dtype;
  double dval;
  int lval;
  char sval [81];
  char msg [81];
  
  if (0 < *status) {
    return *status;
  }
  if (*cval == '\0') {
    *status = 0xcc;
    return 0xcc;
  }
  ffc2uxx(cval,&dtype,ival,&lval,sval,&dval,status);
  if (dtype == 'X') {
    iVar1 = 0x193;
LAB_0013b5ed:
    *status = iVar1;
    goto LAB_0013b5ef;
  }
  if (dtype == 'F') {
LAB_0013b587:
    iVar1 = 0x19c;
    if ((1.8446744073709552e+19 < dval) || (dval < -0.49)) goto LAB_0013b5ed;
    uVar2 = (long)(dval - 9.223372036854776e+18) & (long)dval >> 0x3f | (long)dval;
LAB_0013b5dd:
    *ival = uVar2;
  }
  else {
    if (dtype == 'L') {
      uVar2 = (ulong)lval;
      goto LAB_0013b5dd;
    }
    if ((dtype == 'C') && (iVar1 = ffc2dd(sval,&dval,status), iVar1 < 1)) goto LAB_0013b587;
  }
  if (*status < 1) {
    return *status;
  }
LAB_0013b5ef:
  *ival = 0;
  builtin_strncpy(msg,"Error in ffc2j evaluating string as a long integer: ",0x35);
  strncat(msg,cval,0x1e);
  ffpmsg(msg);
  return *status;
}

Assistant:

int ffc2uj(const char *cval,     /* I - string representation of the value */
          ULONGLONG *ival,       /* O - numerical value of the input string */
          int *status)          /* IO - error status */
/*
  convert formatted string to a ULONGLONG integer value, doing implicit
  datatype conversion if necessary.
*/
{
    char dtype, sval[81], msg[81];
    int lval;
    double dval;
    
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (cval[0] == '\0')
        return(*status = VALUE_UNDEFINED);  /* null value string */
        
    /* convert the keyword to its native datatype */
    ffc2uxx(cval, &dtype, ival, &lval, sval, &dval, status);

    if (dtype == 'X' )
    {
            *status = BAD_INTKEY;
    }
    else if (dtype == 'C')
    {
            /* try reading the string as a number */
            if (ffc2dd(sval, &dval, status) <= 0)
            {
              if (dval > (double)  DULONGLONG_MAX || dval < -0.49)
                *status = NUM_OVERFLOW;
              else
                *ival = (ULONGLONG) dval;
            }
    }
    else if (dtype == 'F')
    {
            if (dval > (double) DULONGLONG_MAX || dval < -0.49)
                *status = NUM_OVERFLOW;
            else
                *ival = (ULONGLONG) dval;
    }
    else if (dtype == 'L')
    {
            *ival = (ULONGLONG) lval;
    }

    if (*status > 0)
    {
            *ival = 0;
            strcpy(msg,"Error in ffc2j evaluating string as a long integer: ");
            strncat(msg,cval,30);
            ffpmsg(msg);
            return(*status);
    }


    return(*status);
}